

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

unique_ptr<pbrt::SimpleVolPathIntegrator,_std::default_delete<pbrt::SimpleVolPathIntegrator>_>
pbrt::SimpleVolPathIntegrator::Create
          (ParameterDictionary *parameters,CameraHandle *camera,SamplerHandle *sampler,
          PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,FileLoc *loc)

{
  int maxDepth;
  undefined1 local_54 [4];
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"maxdepth","");
  local_54 = (undefined1  [4])
             ParameterDictionary::GetOneInt((ParameterDictionary *)camera,&local_50,5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::
  make_unique<pbrt::SimpleVolPathIntegrator,int&,pbrt::CameraHandle&,pbrt::SamplerHandle&,pbrt::PrimitiveHandle&,std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>&>
            ((int *)parameters,(CameraHandle *)local_54,sampler,aggregate,lights);
  return (__uniq_ptr_data<pbrt::SimpleVolPathIntegrator,_std::default_delete<pbrt::SimpleVolPathIntegrator>,_true,_true>
          )(__uniq_ptr_data<pbrt::SimpleVolPathIntegrator,_std::default_delete<pbrt::SimpleVolPathIntegrator>,_true,_true>
            )parameters;
}

Assistant:

std::unique_ptr<SimpleVolPathIntegrator> SimpleVolPathIntegrator::Create(
    const ParameterDictionary &parameters, CameraHandle camera, SamplerHandle sampler,
    PrimitiveHandle aggregate, std::vector<LightHandle> lights, const FileLoc *loc) {
    int maxDepth = parameters.GetOneInt("maxdepth", 5);
    return std::make_unique<SimpleVolPathIntegrator>(maxDepth, camera, sampler, aggregate,
                                                     lights);
}